

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O0

void __thiscall
cfdcapi_key_PrivkeyTweakConversionTest_Test::TestBody
          (cfdcapi_key_PrivkeyTweakConversionTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *str_buffer;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  char *negate;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *priv_tweak_mul;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *priv_tweak_added;
  char *tweak;
  char *privkey;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffce8;
  AssertionResult *in_stack_fffffffffffffcf0;
  CfdErrorCode *in_stack_fffffffffffffcf8;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  void **in_stack_fffffffffffffd08;
  void *in_stack_fffffffffffffd28;
  char **in_stack_fffffffffffffd80;
  AssertHelper local_210;
  Message local_208;
  undefined4 local_1fc;
  AssertionResult local_1f8;
  AssertHelper local_1e8;
  Message local_1e0;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined4 local_1b4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  AssertHelper in_stack_fffffffffffffe68;
  Message local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  char *local_150;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  char **in_stack_ffffffffffffff00;
  AssertHelper in_stack_ffffffffffffff08;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffd08);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x38008a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x205,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3800ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x380142);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,(type *)0x380176);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x206,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x380272);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3802ed);
  local_a0 = "036b13c5a0dd9935fe175b2b9ff86585c231e734b2148149d788a941f1f4f566";
  local_a8 = "98430d10471cf697e2661e31ceb8720750b59a85374290e175799ba5dd06508e";
  local_b0 = (char *)0x0;
  local_14 = CfdPrivkeyTweakAdd(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10.ptr_,
                                (char *)in_stack_ffffffffffffff08.data_,in_stack_ffffffffffffff00);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3803f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x20f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x380453);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3804a8);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&stack0xffffffffffffff18,"priv_tweak_added",
               "\"9bae20d5e7fa8fcde07d795d6eb0d78d12e781b9e957122b4d0244e7cefb45f4\"",local_b0,
               "9bae20d5e7fa8fcde07d795d6eb0d78d12e781b9e957122b4d0244e7cefb45f4");
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff18);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xffffffffffffff10);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x380557);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff08,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x211,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff08,(Message *)&stack0xffffffffffffff10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff08);
      testing::Message::~Message((Message *)0x3805ba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38060f);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcf8);
  }
  pcVar2 = (char *)0x0;
  local_14 = CfdPrivkeyTweakMul(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10.ptr_,
                                (char *)in_stack_ffffffffffffff08.data_,(char **)0x0);
  local_114 = 0;
  pAVar3 = &local_110;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    in_stack_fffffffffffffd80 =
         (char **)testing::AssertionResult::failure_message((AssertionResult *)0x380703);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x21b,(char *)in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message((Message *)0x380766);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3807bb);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_138,"priv_tweak_mul",
               "\"aa71b12accba23b49761a7521e661f07a7e5742ac48cf708b8f9497b3a72a957\"",pcVar2,
               "aa71b12accba23b49761a7521e661f07a7e5742ac48cf708b8f9497b3a72a957");
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x38086a);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x21d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x3808cd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x380922);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcf8);
  }
  local_150 = (char *)0x0;
  local_14 = CfdNegatePrivkey(in_stack_fffffffffffffe68.data_,in_stack_fffffffffffffe60,
                              (char **)in_stack_fffffffffffffe58.ptr_);
  local_164 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x380a02);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x226,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x380a5f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x380ab4);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_188,"negate",
               "\"fc94ec3a5f2266ca01e8a4d460079a78f87cf5b1fd341ef1e849b54ade414bdb\"",local_150,
               "fc94ec3a5f2266ca01e8a4d460079a78f87cf5b1fd341ef1e849b54ade414bdb");
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x380b57);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x228,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe68,&local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe68);
      testing::Message::~Message((Message *)0x380bb4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x380c09);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcf8);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffd28);
  if (local_14 != 0) {
    pcVar2 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(pAVar3,in_stack_fffffffffffffd80);
    local_1b4 = 0;
    pAVar3 = (AssertionResult *)&stack0xfffffffffffffe50;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffd08,
               (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8,(int *)in_stack_fffffffffffffcf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x380d03);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x231,message);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      testing::Message::~Message((Message *)0x380d60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x380db5);
    testing::internal::CmpHelperSTREQ((internal *)&local_1d8,"\"\"","str_buffer","",pcVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      in_stack_fffffffffffffd08 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x380e4a);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x232,(char *)in_stack_fffffffffffffd08);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message((Message *)0x380ea7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x380efc);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffcf8);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffcf8);
  local_1fc = 0;
  pAVar3 = &local_1f8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd08,
             (char *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             (CfdErrorCode *)pAVar3,(int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x380fcc);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x238,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message((Message *)0x381029);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x38107e);
  return;
}

Assistant:

TEST(cfdcapi_key, PrivkeyTweakConversionTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  const char* privkey = "036b13c5a0dd9935fe175b2b9ff86585c231e734b2148149d788a941f1f4f566";
  const char* tweak = "98430d10471cf697e2661e31ceb8720750b59a85374290e175799ba5dd06508e";

  // test for adding tweak
  {
    char* priv_tweak_added = nullptr;
    ret = CfdPrivkeyTweakAdd(handle, privkey, tweak, &priv_tweak_added);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(priv_tweak_added, "9bae20d5e7fa8fcde07d795d6eb0d78d12e781b9e957122b4d0244e7cefb45f4");
      CfdFreeStringBuffer(priv_tweak_added);
    }
  }

  // test for multiplying tweak
  {
    char* priv_tweak_mul = nullptr;

    ret = CfdPrivkeyTweakMul(handle, privkey, tweak, &priv_tweak_mul);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(priv_tweak_mul, "aa71b12accba23b49761a7521e661f07a7e5742ac48cf708b8f9497b3a72a957");
      CfdFreeStringBuffer(priv_tweak_mul);
    }
  }

  {
    char* negate = nullptr;

    ret = CfdNegatePrivkey(handle, privkey, &negate);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(negate, "fc94ec3a5f2266ca01e8a4d460079a78f87cf5b1fd341ef1e849b54ade414bdb");
      CfdFreeStringBuffer(negate);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}